

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O0

bool __thiscall FIX::Message::isAdmin(Message *this)

{
  bool bVar1;
  undefined1 local_78 [8];
  MsgType msgType;
  Message *this_local;
  
  msgType.super_StringField.super_FieldBase.m_metrics._8_8_ = this;
  MsgType::MsgType((MsgType *)local_78);
  bVar1 = FieldMap::getFieldIfSet((FieldMap *)(this + 0x70),(FieldBase *)local_78);
  if (bVar1) {
    this_local._7_1_ = isAdminMsgType((MsgType *)local_78);
  }
  else {
    this_local._7_1_ = false;
  }
  MsgType::~MsgType((MsgType *)local_78);
  return this_local._7_1_;
}

Assistant:

bool isAdmin() const
  { 
    MsgType msgType;
    if( m_header.getFieldIfSet( msgType ) )
      return isAdminMsgType( msgType );
    return false;
  }